

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall
LFPConsumer::LFPConsumer
          (LFPConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  HighFreqDataType local_b0;
  
  HighFreqDataType::HighFreqDataType(&local_b0,hf);
  HFSubConsumer::HFSubConsumer
            (&this->super_HFSubConsumer,&local_b0,(long)ringbufsize,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&local_b0);
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__LFPConsumer_0043a9f0;
  HFParsingInfo::HFParsingInfo(&this->args,parseargs);
  (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_HFSubConsumer).super_HighFreqSub.sockType = ST_FILTERED_CONSUMER;
  return;
}

Assistant:

LFPConsumer::LFPConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}